

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FieldTypesTestCase.cpp
# Opt level: O2

void __thiscall
SuiteFieldTypesTests::TestDateTime_addAndSubtractSeconds::TestDateTime_addAndSubtractSeconds
          (TestDateTime_addAndSubtractSeconds *this)

{
  UnitTest::Test::Test
            (&this->super_Test,"DateTime_addAndSubtractSeconds","FieldTypesTests",
             "/workspace/llm4binary/github/license_all_cmakelists_25/marlowa[P]quickfix/src/C++/test/FieldTypesTestCase.cpp"
             ,0x4f);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__Test_0031d310;
  return;
}

Assistant:

TEST(DateTime_addAndSubtractSeconds)
{
  FIX::DateTime addSeconds(2019,5,6,23,1,1,0);
  addSeconds += 7200; // 2 hours in seconds
  CHECK_EQUAL(2019, addSeconds.getYear());
  CHECK_EQUAL(5, addSeconds.getMonth());
  CHECK_EQUAL(7, addSeconds.getDay());
  CHECK_EQUAL(1, addSeconds.getHour());
  CHECK_EQUAL(1, addSeconds.getMinute());
  CHECK_EQUAL(1, addSeconds.getSecond());

  FIX::DateTime subtractSeconds(2019,5,6,1,1,1,0);
  subtractSeconds += -7200; // 2 hours in seconds

  CHECK_EQUAL(2019, subtractSeconds.getYear());
  CHECK_EQUAL(5, subtractSeconds.getMonth());
  CHECK_EQUAL(5, subtractSeconds.getDay());
  CHECK_EQUAL(23, subtractSeconds.getHour());
  CHECK_EQUAL(1, subtractSeconds.getMinute());
  CHECK_EQUAL(1, subtractSeconds.getSecond());
}